

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_utils.c
# Opt level: O0

WEBP_FILTER_TYPE WebPEstimateBestFilter(uint8_t *data,int width,int height,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int score;
  int best_score;
  WEBP_FILTER_TYPE best_filter;
  int filter;
  int diff3;
  int grad_pred;
  int diff2;
  int diff1;
  int diff0;
  int mean;
  uint8_t *p;
  int bins [4] [16];
  int j;
  int i;
  int local_158;
  int local_154;
  WEBP_FILTER_TYPE local_150;
  WEBP_FILTER_TYPE local_14c;
  uint local_134;
  int local_128 [16];
  undefined4 auStack_e8 [16];
  undefined4 auStack_a8 [16];
  undefined4 auStack_68 [19];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_128,0,0x100);
  for (local_1c = 2; local_1c < local_10 + -1; local_1c = local_1c + 2) {
    pbVar5 = (byte *)(local_8 + local_1c * local_14);
    local_134 = (uint)*pbVar5;
    for (local_18 = 2; local_18 < local_c + -1; local_18 = local_18 + 2) {
      iVar1 = pbVar5[local_18] - local_134;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar2 = (uint)pbVar5[local_18] - (uint)pbVar5[local_18 + -1];
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar3 = (uint)pbVar5[local_18] - (uint)pbVar5[local_18 - local_c];
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      iVar4 = GradientPredictor(pbVar5[local_18 + -1],pbVar5[local_18 - local_c],
                                pbVar5[(local_18 - local_c) + -1]);
      iVar4 = (uint)pbVar5[local_18] - iVar4;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      local_128[iVar1 >> 4] = 1;
      auStack_e8[iVar2 >> 4] = 1;
      auStack_a8[iVar3 >> 4] = 1;
      auStack_68[iVar4 >> 4] = 1;
      local_134 = (int)(local_134 * 3 + (uint)pbVar5[local_18] + 2) >> 2;
    }
  }
  local_150 = WEBP_FILTER_NONE;
  local_154 = 0x7fffffff;
  for (local_14c = WEBP_FILTER_NONE; (int)local_14c < 4;
      local_14c = local_14c + WEBP_FILTER_HORIZONTAL) {
    local_158 = 0;
    for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
      if (0 < local_128[(long)(int)local_14c * 0x10 + (long)local_18]) {
        local_158 = local_18 + local_158;
      }
    }
    if (local_158 < local_154) {
      local_154 = local_158;
      local_150 = local_14c;
    }
  }
  return local_150;
}

Assistant:

WEBP_FILTER_TYPE WebPEstimateBestFilter(const uint8_t* data,
                                        int width, int height, int stride) {
  int i, j;
  int bins[WEBP_FILTER_LAST][SMAX];
  memset(bins, 0, sizeof(bins));

  // We only sample every other pixels. That's enough.
  for (j = 2; j < height - 1; j += 2) {
    const uint8_t* const p = data + j * stride;
    int mean = p[0];
    for (i = 2; i < width - 1; i += 2) {
      const int diff0 = SDIFF(p[i], mean);
      const int diff1 = SDIFF(p[i], p[i - 1]);
      const int diff2 = SDIFF(p[i], p[i - width]);
      const int grad_pred =
          GradientPredictor(p[i - 1], p[i - width], p[i - width - 1]);
      const int diff3 = SDIFF(p[i], grad_pred);
      bins[WEBP_FILTER_NONE][diff0] = 1;
      bins[WEBP_FILTER_HORIZONTAL][diff1] = 1;
      bins[WEBP_FILTER_VERTICAL][diff2] = 1;
      bins[WEBP_FILTER_GRADIENT][diff3] = 1;
      mean = (3 * mean + p[i] + 2) >> 2;
    }
  }
  {
    int filter;
    WEBP_FILTER_TYPE best_filter = WEBP_FILTER_NONE;
    int best_score = 0x7fffffff;
    for (filter = WEBP_FILTER_NONE; filter < WEBP_FILTER_LAST; ++filter) {
      int score = 0;
      for (i = 0; i < SMAX; ++i) {
        if (bins[filter][i] > 0) {
          score += i;
        }
      }
      if (score < best_score) {
        best_score = score;
        best_filter = (WEBP_FILTER_TYPE)filter;
      }
    }
    return best_filter;
  }
}